

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double chi_pdf(double x,double a,double b,double c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double y;
  double pdf;
  double c_local;
  double b_local;
  double a_local;
  double x_local;
  
  if (a < x) {
    dVar1 = (x - a) / b;
    dVar2 = exp(dVar1 * -0.5 * dVar1);
    dVar1 = pow(dVar1,c - 1.0);
    dVar3 = pow(2.0,c * 0.5 + -1.0);
    dVar4 = tgamma(c * 0.5);
    y = (dVar2 * dVar1) / (dVar3 * b * dVar4);
  }
  else {
    y = 0.0;
  }
  return y;
}

Assistant:

double chi_pdf ( double x, double a, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    CHI_PDF evaluates the Chi PDF.
//
//  Discussion:
//
//    PDF(A,B,C;X) = EXP ( - 0.5 * ( ( X - A ) / B )^2 )
//      * ( ( X - A ) / B )^( C - 1 ) /
//      ( 2^( 0.5 * C - 1 ) * B * GAMMA ( 0.5 * C ) )
//
//    CHI(A,B,1) is the Half Normal PDF;
//    CHI(0,B,2) is the Rayleigh PDF;
//    CHI(0,B,3) is the Maxwell PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//    A <= X
//
//    Input, double A, B, C, the parameters of the PDF.
//    0 < B,
//    0 < C.
//
//    Output, double PDF, the value of the PDF.
//
{
  double pdf;
  double y;

  if ( x <= a )
  {
    pdf = 0.0;
  }
  else
  {
    y = ( x - a ) / b;

    pdf = exp ( - 0.5 * y * y ) * pow ( y, ( c - 1.0 ) ) /
      ( pow ( 2.0, ( 0.5 * c - 1.0 ) ) * b * tgamma ( 0.5 * c ) );
  }

  return pdf;
}